

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefileTargets
          (cmLocalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  pointer puVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  string *psVar5;
  pointer puVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_108;
  string makefileName;
  string makeTargetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string makefile2;
  string localName;
  string local_50;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  localName._M_dataplus._M_p = (pointer)&localName.field_2;
  localName._M_string_length = 0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  localName.field_2._M_local_buf[0] = '\0';
  puVar6 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar1) {
      std::__cxx11::string::~string((string *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      return;
    }
    TVar3 = cmGeneratorTarget::GetType
                      ((puVar6->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
    if (TVar3 == EXECUTABLE) {
LAB_005316fe:
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((puVar6->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)emitted,psVar4);
      GetRelativeTargetDirectory_abi_cxx11_
                (&makefileName,this,
                 (puVar6->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      cmStrCat<std::__cxx11::string,char_const(&)[6]>
                (&makefile2,&makefileName,(char (*) [6])"/rule");
      std::__cxx11::string::operator=((string *)&localName,(string *)&makefile2);
      std::__cxx11::string::~string((string *)&makefile2);
      std::__cxx11::string::~string((string *)&makefileName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&makefile2,"CMakeFiles/Makefile2",(allocator<char> *)&makefileName);
      GetRecursiveMakeCall(&makefileName,this,&makefile2,&localName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 &makefileName);
      std::__cxx11::string::~string((string *)&makefileName);
      psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      CreateCDCommand(this,&commands,psVar4,psVar5);
      WriteMakeRule(this,ruleFileStream,"Convenience name for target.",&localName,&depends,&commands
                    ,true,false);
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((puVar6->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      bVar2 = std::operator!=(&localName,psVar4);
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&commands);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&localName);
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((puVar6->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                            .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        WriteMakeRule(this,ruleFileStream,"Convenience name for target.",psVar4,&depends,&commands,
                      true,false);
      }
      GetRelativeTargetDirectory_abi_cxx11_
                (&makeTargetName,this,
                 (puVar6->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      cmStrCat<std::__cxx11::string,char_const(&)[12]>
                (&makefileName,&makeTargetName,(char (*) [12])"/build.make");
      std::__cxx11::string::~string((string *)&makeTargetName);
      GetRelativeTargetDirectory_abi_cxx11_
                (&local_108,this,
                 (puVar6->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      cmStrCat<std::__cxx11::string,char_const(&)[7]>
                (&makeTargetName,&local_108,(char (*) [7])"/build");
      std::__cxx11::string::~string((string *)&local_108);
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((puVar6->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[6]>
                (&local_108,psVar4,(char (*) [6])0x7e2871);
      std::__cxx11::string::operator=((string *)&localName,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      GetRecursiveMakeCall(&local_108,this,&makefileName,&makeTargetName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 &local_108);
      std::__cxx11::string::~string((string *)&local_108);
      psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      CreateCDCommand(this,&commands,psVar4,psVar5);
      WriteMakeRule(this,ruleFileStream,"fast build rule for target.",&localName,&depends,&commands,
                    true,false);
      this_00 = (puVar6->_M_t).
                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
      GetConfigName_abi_cxx11_(&local_108,this);
      bVar2 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_00,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      if (bVar2) {
        GetRelativeTargetDirectory_abi_cxx11_
                  (&local_50,this,
                   (puVar6->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        cmStrCat<std::__cxx11::string,char_const(&)[12]>
                  (&local_108,&local_50,(char (*) [12])"/preinstall");
        std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_50);
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((puVar6->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                            .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        cmStrCat<std::__cxx11::string_const&,char_const(&)[12]>
                  (&local_108,psVar4,(char (*) [12])"/preinstall");
        std::__cxx11::string::operator=((string *)&localName,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&depends);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&commands);
        GetRecursiveMakeCall(&local_108,this,&makefile2,&makeTargetName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   &local_108);
        std::__cxx11::string::~string((string *)&local_108);
        psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
        psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
        CreateCDCommand(this,&commands,psVar4,psVar5);
        WriteMakeRule(this,ruleFileStream,"Manual pre-install relink rule for target.",&localName,
                      &depends,&commands,true,false);
      }
      std::__cxx11::string::~string((string *)&makeTargetName);
      std::__cxx11::string::~string((string *)&makefileName);
      std::__cxx11::string::~string((string *)&makefile2);
    }
    else {
      TVar3 = cmGeneratorTarget::GetType
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar3 == STATIC_LIBRARY) goto LAB_005316fe;
      TVar3 = cmGeneratorTarget::GetType
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar3 == SHARED_LIBRARY) goto LAB_005316fe;
      TVar3 = cmGeneratorTarget::GetType
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar3 == MODULE_LIBRARY) goto LAB_005316fe;
      TVar3 = cmGeneratorTarget::GetType
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar3 == OBJECT_LIBRARY) goto LAB_005316fe;
      TVar3 = cmGeneratorTarget::GetType
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar3 == UTILITY) goto LAB_005316fe;
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefileTargets(
  std::ostream& ruleFileStream, std::set<std::string>& emitted)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // for each target we just provide a rule to cd up to the top and do a make
  // on the target
  std::string localName;
  for (const auto& target : this->GetGeneratorTargets()) {
    if ((target->GetType() == cmStateEnums::EXECUTABLE) ||
        (target->GetType() == cmStateEnums::STATIC_LIBRARY) ||
        (target->GetType() == cmStateEnums::SHARED_LIBRARY) ||
        (target->GetType() == cmStateEnums::MODULE_LIBRARY) ||
        (target->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
        (target->GetType() == cmStateEnums::UTILITY)) {
      emitted.insert(target->GetName());

      // for subdirs add a rule to build this specific target by name.
      localName =
        cmStrCat(this->GetRelativeTargetDirectory(target.get()), "/rule");
      commands.clear();
      depends.clear();

      // Build the target for this pass.
      std::string makefile2 = "CMakeFiles/Makefile2";
      commands.push_back(this->GetRecursiveMakeCall(makefile2, localName));
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
      this->WriteMakeRule(ruleFileStream, "Convenience name for target.",
                          localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      if (localName != target->GetName()) {
        commands.clear();
        depends.push_back(localName);
        this->WriteMakeRule(ruleFileStream, "Convenience name for target.",
                            target->GetName(), depends, commands, true);
      }

      // Add a fast rule to build the target
      std::string makefileName = cmStrCat(
        this->GetRelativeTargetDirectory(target.get()), "/build.make");
      // make sure the makefile name is suitable for a makefile
      std::string makeTargetName =
        cmStrCat(this->GetRelativeTargetDirectory(target.get()), "/build");
      localName = cmStrCat(target->GetName(), "/fast");
      depends.clear();
      commands.clear();
      commands.push_back(
        this->GetRecursiveMakeCall(makefileName, makeTargetName));
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
      this->WriteMakeRule(ruleFileStream, "fast build rule for target.",
                          localName, depends, commands, true);

      // Add a local name for the rule to relink the target before
      // installation.
      if (target->NeedRelinkBeforeInstall(this->GetConfigName())) {
        makeTargetName = cmStrCat(
          this->GetRelativeTargetDirectory(target.get()), "/preinstall");
        localName = cmStrCat(target->GetName(), "/preinstall");
        depends.clear();
        commands.clear();
        commands.push_back(
          this->GetRecursiveMakeCall(makefile2, makeTargetName));
        this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                              this->GetCurrentBinaryDirectory());
        this->WriteMakeRule(ruleFileStream,
                            "Manual pre-install relink rule for target.",
                            localName, depends, commands, true);
      }
    }
  }
}